

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::MILSpec::Operation::_InternalSerialize
          (Operation *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  char *data;
  string *s;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
  *pMVar7;
  MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
  **__p;
  type ppMVar8;
  type ppMVar9;
  const_pointer pvVar10;
  const_reference pvVar11;
  uint8_t *puVar12;
  NamedValueType *value;
  Block *value_00;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  *pMVar13;
  size_type sVar14;
  MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  **__p_00;
  type ppMVar15;
  type ppMVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  const_pointer pvVar18;
  const_reference pvVar19;
  void *data_00;
  const_iterator local_148;
  undefined1 local_130 [8];
  const_iterator it_3;
  size_type i_3;
  const_iterator local_108;
  undefined1 local_f0 [8];
  const_iterator it_2;
  size_type n_3;
  unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
  items_1;
  uint n_2;
  uint i_2;
  uint n_1;
  uint i_1;
  undefined1 local_a0 [8];
  const_iterator it_1;
  size_type i;
  const_iterator local_78;
  undefined1 local_50 [8];
  const_iterator it;
  size_type n;
  unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[]>_>
  items;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  Operation *this_local;
  
  items._M_t.
  super___uniq_ptr_impl<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_**,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[]>_>
  .
  super__Head_base<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_**,_false>
  ._M_head_impl._4_4_ = 0;
  _internal_type_abi_cxx11_(this);
  uVar6 = std::__cxx11::string::empty();
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar6 & 1) == 0) {
    _internal_type_abi_cxx11_(this);
    data = (char *)std::__cxx11::string::data();
    _internal_type_abi_cxx11_(this);
    iVar4 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (data,iVar4,SERIALIZE,"CoreML.Specification.MILSpec.Operation.type");
    s = _internal_type_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,1,s,target);
  }
  pMVar7 = _internal_inputs_abi_cxx11_(this);
  bVar3 = google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
          ::empty(pMVar7);
  if (!bVar3) {
    bVar3 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if (bVar3) {
      pMVar7 = _internal_inputs_abi_cxx11_(this);
      sVar14 = google::protobuf::
               Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
               ::size(pMVar7);
      if (1 < sVar14) {
        pMVar7 = _internal_inputs_abi_cxx11_(this);
        sVar14 = google::protobuf::
                 Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
                 ::size(pMVar7);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = sVar14;
        uVar6 = SUB168(auVar1 * ZEXT816(8),0);
        if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
          uVar6 = 0xffffffffffffffff;
        }
        __p = (MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
               **)operator_new__(uVar6);
        std::
        unique_ptr<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Argument>const*[],std::default_delete<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Argument>const*[]>>
        ::
        unique_ptr<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Argument>const**,std::default_delete<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Argument>const*[]>,void,bool>
                  ((unique_ptr<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Argument>const*[],std::default_delete<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Argument>const*[]>>
                    *)&n,__p);
        it.it_.bucket_index_ = 0;
        pMVar7 = _internal_inputs_abi_cxx11_(this);
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
        ::begin((const_iterator *)local_50,pMVar7);
        while( true ) {
          pMVar7 = _internal_inputs_abi_cxx11_(this);
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
          ::end(&local_78,pMVar7);
          bVar3 = google::protobuf::operator!=((const_iterator *)local_50,&local_78);
          if (!bVar3) break;
          pvVar11 = google::protobuf::
                    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
                    ::const_iterator::operator*((const_iterator *)local_50);
          ppMVar8 = std::
                    unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[]>_>
                    ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[]>_>
                                  *)&n,it.it_.bucket_index_);
          *ppMVar8 = pvVar11;
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
          ::const_iterator::operator++((const_iterator *)local_50);
          it.it_.bucket_index_ = it.it_.bucket_index_ + 1;
        }
        ppMVar8 = std::
                  unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[]>_>
                  ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[]>_>
                                *)&n,0);
        ppMVar9 = std::
                  unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[]>_>
                  ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[]>_>
                                *)&n,it.it_.bucket_index_);
        std::
        sort<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Argument>const**,google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Argument>const*>>
                  (ppMVar8,ppMVar9);
        for (it_1.it_.bucket_index_ = 0; it_1.it_.bucket_index_ < it.it_.bucket_index_;
            it_1.it_.bucket_index_ = it_1.it_.bucket_index_ + 1) {
          ppMVar8 = std::
                    unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[]>_>
                    ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[]>_>
                                  *)&n,it_1.it_.bucket_index_);
          pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*ppMVar8;
          ppMVar8 = std::
                    unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[]>_>
                    ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[]>_>
                                  *)&n,it_1.it_.bucket_index_);
          stream_local = (EpsCopyOutputStream *)
                         google::protobuf::internal::
                         MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                         ::InternalSerialize(2,pbVar17,(Argument *)(*ppMVar8 + 0x20),
                                             (uint8_t *)stream_local,stream);
          ppMVar8 = std::
                    unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[]>_>
                    ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[]>_>
                                  *)&n,it_1.it_.bucket_index_);
          _InternalSerialize(unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)::
          Argument>_const__(*ppMVar8);
        }
        std::
        unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[]>_>
        ::~unique_ptr((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>_*[]>_>
                       *)&n);
        goto LAB_0025b9e7;
      }
    }
    pMVar7 = _internal_inputs_abi_cxx11_(this);
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
    ::begin((const_iterator *)local_a0,pMVar7);
    while( true ) {
      pMVar7 = _internal_inputs_abi_cxx11_(this);
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
      ::end((const_iterator *)&n_1,pMVar7);
      bVar3 = google::protobuf::operator!=((const_iterator *)local_a0,(const_iterator *)&n_1);
      if (!bVar3) break;
      pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                google::protobuf::
                Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
                ::const_iterator::operator->((const_iterator *)local_a0);
      pvVar10 = google::protobuf::
                Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
                ::const_iterator::operator->((const_iterator *)local_a0);
      stream_local = (EpsCopyOutputStream *)
                     google::protobuf::internal::
                     MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                     ::InternalSerialize(2,pbVar17,(Argument *)(pvVar10 + 0x20),
                                         (uint8_t *)stream_local,stream);
      pvVar11 = google::protobuf::
                Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
                ::const_iterator::operator*((const_iterator *)local_a0);
      _InternalSerialize(unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)::
      Argument>_const__(pvVar11);
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
      ::const_iterator::operator++((const_iterator *)local_a0);
    }
  }
LAB_0025b9e7:
  i_2 = 0;
  uVar5 = _internal_outputs_size(this);
  for (; i_2 < uVar5; i_2 = i_2 + 1) {
    puVar12 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local)
    ;
    value = _internal_outputs(this,i_2);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::MILSpec::NamedValueType>
                             (3,value,puVar12,stream);
  }
  items_1._M_t.
  super___uniq_ptr_impl<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
  .
  super__Head_base<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_false>
  ._M_head_impl._4_4_ = 0;
  items_1._M_t.
  super___uniq_ptr_impl<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
  .
  super__Head_base<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_false>
  ._M_head_impl._0_4_ = _internal_blocks_size(this);
  for (; items_1._M_t.
         super___uniq_ptr_impl<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
         .
         super__Head_base<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_false>
         ._M_head_impl._4_4_ <
         (uint)items_1._M_t.
               super___uniq_ptr_impl<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
               .
               super__Head_base<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_false>
               ._M_head_impl;
      items_1._M_t.
      super___uniq_ptr_impl<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
      .
      super__Head_base<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_false>
      ._M_head_impl._4_4_ =
           items_1._M_t.
           super___uniq_ptr_impl<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
           .
           super__Head_base<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_false>
           ._M_head_impl._4_4_ + 1) {
    puVar12 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local)
    ;
    value_00 = _internal_blocks(this,items_1._M_t.
                                     super___uniq_ptr_impl<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                                     .
                                     super__Head_base<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_**,_false>
                                     ._M_head_impl._4_4_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::MILSpec::Block>
                             (4,value_00,puVar12,stream);
  }
  pMVar13 = _internal_attributes_abi_cxx11_(this);
  bVar3 = google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
          ::empty(pMVar13);
  if (!bVar3) {
    bVar3 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if (bVar3) {
      pMVar13 = _internal_attributes_abi_cxx11_(this);
      sVar14 = google::protobuf::
               Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
               ::size(pMVar13);
      if (1 < sVar14) {
        pMVar13 = _internal_attributes_abi_cxx11_(this);
        sVar14 = google::protobuf::
                 Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
                 ::size(pMVar13);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = sVar14;
        uVar6 = SUB168(auVar2 * ZEXT816(8),0);
        if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
          uVar6 = 0xffffffffffffffff;
        }
        __p_00 = (MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
                  **)operator_new__(uVar6);
        std::
        unique_ptr<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const*[],std::default_delete<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const*[]>>
        ::
        unique_ptr<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const**,std::default_delete<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const*[]>,void,bool>
                  ((unique_ptr<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const*[],std::default_delete<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const*[]>>
                    *)&n_3,__p_00);
        it_2.it_.bucket_index_ = 0;
        pMVar13 = _internal_attributes_abi_cxx11_(this);
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
        ::begin((const_iterator *)local_f0,pMVar13);
        while( true ) {
          pMVar13 = _internal_attributes_abi_cxx11_(this);
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
          ::end(&local_108,pMVar13);
          bVar3 = google::protobuf::operator!=((const_iterator *)local_f0,&local_108);
          if (!bVar3) break;
          pvVar19 = google::protobuf::
                    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
                    ::const_iterator::operator*((const_iterator *)local_f0);
          ppMVar15 = std::
                     unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                     ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                                   *)&n_3,it_2.it_.bucket_index_);
          *ppMVar15 = pvVar19;
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
          ::const_iterator::operator++((const_iterator *)local_f0);
          it_2.it_.bucket_index_ = it_2.it_.bucket_index_ + 1;
        }
        ppMVar15 = std::
                   unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                   ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                                 *)&n_3,0);
        ppMVar16 = std::
                   unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                   ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                                 *)&n_3,it_2.it_.bucket_index_);
        std::
        sort<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const**,google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,CoreML::Specification::MILSpec::Value>const*>>
                  (ppMVar15,ppMVar16);
        for (it_3.it_.bucket_index_ = 0; it_3.it_.bucket_index_ < it_2.it_.bucket_index_;
            it_3.it_.bucket_index_ = it_3.it_.bucket_index_ + 1) {
          ppMVar15 = std::
                     unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                     ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                                   *)&n_3,it_3.it_.bucket_index_);
          pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*ppMVar15;
          ppMVar15 = std::
                     unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                     ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                                   *)&n_3,it_3.it_.bucket_index_);
          stream_local = (EpsCopyOutputStream *)
                         google::protobuf::internal::
                         MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                         ::InternalSerialize(5,pbVar17,(Value *)(*ppMVar15 + 0x20),
                                             (uint8_t *)stream_local,stream);
          ppMVar15 = std::
                     unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                     ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                                   *)&n_3,it_3.it_.bucket_index_);
          _InternalSerialize(unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)::
          Value>_const__((ConstPtr)*ppMVar15);
        }
        std::
        unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
        ::~unique_ptr((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>_*[]>_>
                       *)&n_3);
        goto LAB_0025be6d;
      }
    }
    pMVar13 = _internal_attributes_abi_cxx11_(this);
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
    ::begin((const_iterator *)local_130,pMVar13);
    while( true ) {
      pMVar13 = _internal_attributes_abi_cxx11_(this);
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
      ::end(&local_148,pMVar13);
      bVar3 = google::protobuf::operator!=((const_iterator *)local_130,&local_148);
      if (!bVar3) break;
      pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                google::protobuf::
                Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
                ::const_iterator::operator->((const_iterator *)local_130);
      pvVar18 = google::protobuf::
                Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
                ::const_iterator::operator->((const_iterator *)local_130);
      stream_local = (EpsCopyOutputStream *)
                     google::protobuf::internal::
                     MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                     ::InternalSerialize(5,pbVar17,(Value *)(pvVar18 + 0x20),(uint8_t *)stream_local
                                         ,stream);
      pvVar19 = google::protobuf::
                Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
                ::const_iterator::operator*((const_iterator *)local_130);
      _InternalSerialize(unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)::Value>_const__
                ((ConstPtr)pvVar19);
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
      ::const_iterator::operator++((const_iterator *)local_130);
    }
  }
LAB_0025be6d:
  bVar3 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar3) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data_00 = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    iVar4 = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data_00,iVar4,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* Operation::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.MILSpec.Operation)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // string type = 1;
  if (!this->_internal_type().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_type().data(), static_cast<int>(this->_internal_type().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.MILSpec.Operation.type");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_type(), target);
  }

  // map<string, .CoreML.Specification.MILSpec.Argument> inputs = 2;
  if (!this->_internal_inputs().empty()) {
    typedef ::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Argument >::const_pointer
        ConstPtr;
    typedef ConstPtr SortItem;
    typedef ::PROTOBUF_NAMESPACE_ID::internal::CompareByDerefFirst<SortItem> Less;
    struct Utf8Check {
      static void Check(ConstPtr p) {
        (void)p;
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
          p->first.data(), static_cast<int>(p->first.length()),
          ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.MILSpec.Operation.InputsEntry.key");
      }
    };

    if (stream->IsSerializationDeterministic() &&
        this->_internal_inputs().size() > 1) {
      ::std::unique_ptr<SortItem[]> items(
          new SortItem[this->_internal_inputs().size()]);
      typedef ::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Argument >::size_type size_type;
      size_type n = 0;
      for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Argument >::const_iterator
          it = this->_internal_inputs().begin();
          it != this->_internal_inputs().end(); ++it, ++n) {
        items[static_cast<ptrdiff_t>(n)] = SortItem(&*it);
      }
      ::std::sort(&items[0], &items[static_cast<ptrdiff_t>(n)], Less());
      for (size_type i = 0; i < n; i++) {
        target = Operation_InputsEntry_DoNotUse::Funcs::InternalSerialize(2, items[static_cast<ptrdiff_t>(i)]->first, items[static_cast<ptrdiff_t>(i)]->second, target, stream);
        Utf8Check::Check(&(*items[static_cast<ptrdiff_t>(i)]));
      }
    } else {
      for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Argument >::const_iterator
          it = this->_internal_inputs().begin();
          it != this->_internal_inputs().end(); ++it) {
        target = Operation_InputsEntry_DoNotUse::Funcs::InternalSerialize(2, it->first, it->second, target, stream);
        Utf8Check::Check(&(*it));
      }
    }
  }

  // repeated .CoreML.Specification.MILSpec.NamedValueType outputs = 3;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_outputs_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(3, this->_internal_outputs(i), target, stream);
  }

  // repeated .CoreML.Specification.MILSpec.Block blocks = 4;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_blocks_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(4, this->_internal_blocks(i), target, stream);
  }

  // map<string, .CoreML.Specification.MILSpec.Value> attributes = 5;
  if (!this->_internal_attributes().empty()) {
    typedef ::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Value >::const_pointer
        ConstPtr;
    typedef ConstPtr SortItem;
    typedef ::PROTOBUF_NAMESPACE_ID::internal::CompareByDerefFirst<SortItem> Less;
    struct Utf8Check {
      static void Check(ConstPtr p) {
        (void)p;
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
          p->first.data(), static_cast<int>(p->first.length()),
          ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.MILSpec.Operation.AttributesEntry.key");
      }
    };

    if (stream->IsSerializationDeterministic() &&
        this->_internal_attributes().size() > 1) {
      ::std::unique_ptr<SortItem[]> items(
          new SortItem[this->_internal_attributes().size()]);
      typedef ::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Value >::size_type size_type;
      size_type n = 0;
      for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Value >::const_iterator
          it = this->_internal_attributes().begin();
          it != this->_internal_attributes().end(); ++it, ++n) {
        items[static_cast<ptrdiff_t>(n)] = SortItem(&*it);
      }
      ::std::sort(&items[0], &items[static_cast<ptrdiff_t>(n)], Less());
      for (size_type i = 0; i < n; i++) {
        target = Operation_AttributesEntry_DoNotUse::Funcs::InternalSerialize(5, items[static_cast<ptrdiff_t>(i)]->first, items[static_cast<ptrdiff_t>(i)]->second, target, stream);
        Utf8Check::Check(&(*items[static_cast<ptrdiff_t>(i)]));
      }
    } else {
      for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Value >::const_iterator
          it = this->_internal_attributes().begin();
          it != this->_internal_attributes().end(); ++it) {
        target = Operation_AttributesEntry_DoNotUse::Funcs::InternalSerialize(5, it->first, it->second, target, stream);
        Utf8Check::Check(&(*it));
      }
    }
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.MILSpec.Operation)
  return target;
}